

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

int DoSharpArgbToYuv(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int rgb_step,int rgb_stride,
                    int rgb_bit_depth,uint8_t *y_ptr,int y_stride,uint8_t *u_ptr,int u_stride,
                    uint8_t *v_ptr,int v_stride,int yuv_bit_depth,int width,int height,
                    SharpYuvConversionMatrix *yuv_matrix,SharpYuvTransferFunctionType transfer_type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  fixed_y_t *__ptr;
  uint16_t *__ptr_00;
  SharpYuvConversionMatrix *__ptr_01;
  uint16_t *__ptr_02;
  fixed_y_t *__ptr_03;
  int16_t *__ptr_04;
  int16_t *__ptr_05;
  ulong uVar6;
  fixed_t *pfVar7;
  uint64_t uVar8;
  int in_R9D;
  double dVar9;
  int in_stack_00000040;
  int in_stack_00000048;
  fixed_t *next_uv;
  fixed_y_t *src2_1;
  fixed_y_t *src1_1;
  uint64_t diff_y_sum;
  fixed_t *prev_uv;
  fixed_t *cur_uv;
  fixed_y_t *src2;
  fixed_y_t *src1;
  int is_last_row;
  int ok;
  uint64_t diff_y_threshold;
  fixed_t *target_uv;
  fixed_t *best_uv;
  fixed_y_t *target_y;
  fixed_y_t *best_y;
  fixed_t *best_rgb_uv;
  fixed_t *target_uv_base;
  fixed_t *best_uv_base;
  fixed_y_t *best_rgb_y;
  fixed_y_t *target_y_base;
  fixed_y_t *best_y_base;
  fixed_y_t *tmp_buffer;
  int iter;
  int j;
  uint64_t prev_diff_y_sum;
  int y_bit_depth;
  int uv_h;
  int uv_w;
  int h;
  int w;
  fixed_y_t *pfVar10;
  undefined4 in_stack_fffffffffffffea0;
  SharpYuvTransferFunctionType in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  SharpYuvTransferFunctionType in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  fixed_t *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined8 uVar11;
  fixed_y_t *in_stack_fffffffffffffef0;
  fixed_y_t *in_stack_fffffffffffffef8;
  fixed_y_t *in_stack_ffffffffffffff00;
  fixed_t *in_stack_ffffffffffffff08;
  fixed_y_t *in_stack_ffffffffffffff10;
  fixed_y_t *local_e8;
  fixed_y_t *in_stack_ffffffffffffff20;
  fixed_y_t *pfVar12;
  int v_stride_00;
  fixed_y_t *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  int local_cc;
  int16_t *__src;
  fixed_y_t *__dest;
  SharpYuvConversionMatrix *yuv_matrix_00;
  uint16_t *local_a8;
  int local_68;
  int local_64;
  fixed_t *local_60;
  
  uVar1 = in_stack_00000040 + 1U & 0xfffffffe;
  uVar2 = in_stack_00000048 + 1U & 0xfffffffe;
  iVar3 = (int)(in_stack_00000040 + 1U) >> 1;
  iVar4 = GetPrecisionShift(in_R9D);
  iVar4 = in_R9D + iVar4;
  local_60 = (fixed_t *)0xffffffffffffffff;
  uVar11 = 2;
  __ptr = (fixed_y_t *)
          SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_00 = (uint16_t *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_01 = (SharpYuvConversionMatrix *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_02 = (uint16_t *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_03 = (fixed_y_t *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_04 = (int16_t *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  __ptr_05 = (int16_t *)
             SafeMalloc(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  dVar9 = (double)(int)uVar1 * 3.0 * (double)(int)uVar2;
  uVar6 = (ulong)dVar9;
  pfVar7 = (fixed_t *)(uVar6 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f);
  if (((((__ptr_00 == (uint16_t *)0x0) || (__ptr_03 == (fixed_y_t *)0x0)) ||
       (__ptr_01 == (SharpYuvConversionMatrix *)0x0)) ||
      ((__ptr_04 == (int16_t *)0x0 || (__ptr_02 == (uint16_t *)0x0)))) ||
     ((__ptr_05 == (int16_t *)0x0 || (__ptr == (fixed_y_t *)0x0)))) {
    local_cc = 0;
  }
  else {
    local_e8 = in_stack_ffffffffffffff10;
    __src = __ptr_04;
    __dest = __ptr_03;
    yuv_matrix_00 = __ptr_01;
    for (local_64 = 0; local_64 < in_stack_00000048; local_64 = local_64 + 2) {
      in_stack_ffffffffffffff30 = (uint)(local_64 == in_stack_00000048 + -1);
      in_stack_ffffffffffffff20 = __ptr + (int)(uVar1 * 3);
      pfVar10 = __ptr;
      in_stack_ffffffffffffff28 = __ptr;
      ImportOneRow((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (uint8_t *)in_stack_fffffffffffffec8,
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                   (fixed_y_t *)CONCAT44(in_R9D,in_stack_fffffffffffffee0));
      if (in_stack_ffffffffffffff30 == 0) {
        pfVar12 = in_stack_ffffffffffffff20;
        ImportOneRow((uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (uint8_t *)in_stack_fffffffffffffec8,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                     (fixed_y_t *)CONCAT44(in_R9D,in_stack_fffffffffffffee0));
        pfVar10 = in_stack_ffffffffffffff20;
        in_stack_ffffffffffffff20 = pfVar12;
      }
      else {
        memcpy(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,(long)(int)(uVar1 * 3) << 1);
      }
      StoreGray((fixed_y_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),pfVar10,0
               );
      StoreGray((fixed_y_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),pfVar10,0
               );
      UpdateW((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      UpdateW((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      UpdateChroma((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (fixed_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      memcpy(__dest,__src,(long)(iVar3 * 3) << 1);
      __dest = __dest + iVar3 * 3;
      yuv_matrix_00 =
           (SharpYuvConversionMatrix *)((long)yuv_matrix_00->rgb_to_y + (long)(int)(uVar1 << 1) * 2)
      ;
      __src = __src + iVar3 * 3;
    }
    local_68 = 0;
    while( true ) {
      v_stride_00 = (int)in_stack_ffffffffffffff28;
      iVar5 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      if (3 < local_68) break;
      in_stack_ffffffffffffff08 = (fixed_t *)0x0;
      local_64 = 0;
      pfVar10 = __ptr_03;
      __src = __ptr_04;
      __dest = __ptr_03;
      yuv_matrix_00 = __ptr_01;
      local_a8 = __ptr_00;
      do {
        local_e8 = pfVar10;
        in_stack_fffffffffffffef8 = __ptr + (int)(uVar1 * 3);
        if (local_64 < (int)(uVar2 - 2)) {
          iVar5 = iVar3 * 3;
        }
        else {
          iVar5 = 0;
        }
        pfVar10 = local_e8 + iVar5;
        in_stack_ffffffffffffff00 = __ptr;
        InterpolateTwoRows((fixed_y_t *)CONCAT44(iVar5,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8,
                           (fixed_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (fixed_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb4,
                           (fixed_y_t *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (fixed_y_t *)CONCAT44(in_R9D,in_stack_fffffffffffffee0),(int)uVar11);
        in_stack_fffffffffffffef0 = pfVar10;
        UpdateW((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        UpdateW((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        UpdateChroma((fixed_y_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (fixed_y_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (fixed_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
        uVar8 = (*SharpYuvUpdateY)((uint16_t *)yuv_matrix_00,__ptr_02,local_a8,uVar1 << 1,iVar4);
        in_stack_ffffffffffffff08 = (fixed_t *)(uVar8 + (long)in_stack_ffffffffffffff08);
        (*SharpYuvUpdateRGB)(__src,__ptr_05,(int16_t *)__dest,iVar3 * 3);
        v_stride_00 = (int)in_stack_ffffffffffffff28;
        iVar5 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        local_a8 = local_a8 + (int)(uVar1 << 1);
        __dest = __dest + iVar3 * 3;
        yuv_matrix_00 =
             (SharpYuvConversionMatrix *)
             ((long)yuv_matrix_00->rgb_to_y + (long)(int)(uVar1 << 1) * 2);
        __src = __src + iVar3 * 3;
        local_64 = local_64 + 2;
      } while (local_64 < (int)uVar2);
      if ((0 < local_68) &&
         ((in_stack_ffffffffffffff08 < pfVar7 || (local_60 < in_stack_ffffffffffffff08)))) break;
      local_68 = local_68 + 1;
      local_60 = in_stack_ffffffffffffff08;
    }
    local_cc = ConvertWRGBToYUV(local_e8,in_stack_ffffffffffffff08,
                                (uint8_t *)in_stack_ffffffffffffff00,iVar5,
                                (uint8_t *)in_stack_fffffffffffffef0,(int)((ulong)uVar11 >> 0x20),
                                (uint8_t *)in_stack_ffffffffffffff20,v_stride_00,
                                in_stack_ffffffffffffff30,(int)pfVar7,(int)__src,(int)__dest,
                                yuv_matrix_00);
  }
  free(__ptr_00);
  free(__ptr_03);
  free(__ptr_01);
  free(__ptr_04);
  free(__ptr_02);
  free(__ptr_05);
  free(__ptr);
  return local_cc;
}

Assistant:

static int DoSharpArgbToYuv(const uint8_t* r_ptr, const uint8_t* g_ptr,
                            const uint8_t* b_ptr, int rgb_step, int rgb_stride,
                            int rgb_bit_depth, uint8_t* y_ptr, int y_stride,
                            uint8_t* u_ptr, int u_stride, uint8_t* v_ptr,
                            int v_stride, int yuv_bit_depth, int width,
                            int height,
                            const SharpYuvConversionMatrix* yuv_matrix,
                            SharpYuvTransferFunctionType transfer_type) {
  // we expand the right/bottom border if needed
  const int w = (width + 1) & ~1;
  const int h = (height + 1) & ~1;
  const int uv_w = w >> 1;
  const int uv_h = h >> 1;
  const int y_bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  uint64_t prev_diff_y_sum = ~0;
  int j, iter;

  // TODO(skal): allocate one big memory chunk. But for now, it's easier
  // for valgrind debugging to have several chunks.
  fixed_y_t* const tmp_buffer = SAFE_ALLOC(w * 3, 2, fixed_y_t);   // scratch
  fixed_y_t* const best_y_base = SAFE_ALLOC(w, h, fixed_y_t);
  fixed_y_t* const target_y_base = SAFE_ALLOC(w, h, fixed_y_t);
  fixed_y_t* const best_rgb_y = SAFE_ALLOC(w, 2, fixed_y_t);
  fixed_t* const best_uv_base = SAFE_ALLOC(uv_w * 3, uv_h, fixed_t);
  fixed_t* const target_uv_base = SAFE_ALLOC(uv_w * 3, uv_h, fixed_t);
  fixed_t* const best_rgb_uv = SAFE_ALLOC(uv_w * 3, 1, fixed_t);
  fixed_y_t* best_y = best_y_base;
  fixed_y_t* target_y = target_y_base;
  fixed_t* best_uv = best_uv_base;
  fixed_t* target_uv = target_uv_base;
  const uint64_t diff_y_threshold = (uint64_t)(3.0 * w * h);
  int ok;
  assert(w > 0);
  assert(h > 0);

  if (best_y_base == NULL || best_uv_base == NULL ||
      target_y_base == NULL || target_uv_base == NULL ||
      best_rgb_y == NULL || best_rgb_uv == NULL ||
      tmp_buffer == NULL) {
    ok = 0;
    goto End;
  }

  // Import RGB samples to W/RGB representation.
  for (j = 0; j < height; j += 2) {
    const int is_last_row = (j == height - 1);
    fixed_y_t* const src1 = tmp_buffer + 0 * w;
    fixed_y_t* const src2 = tmp_buffer + 3 * w;

    // prepare two rows of input
    ImportOneRow(r_ptr, g_ptr, b_ptr, rgb_step, rgb_bit_depth, width,
                 src1);
    if (!is_last_row) {
      ImportOneRow(r_ptr + rgb_stride, g_ptr + rgb_stride, b_ptr + rgb_stride,
                   rgb_step, rgb_bit_depth, width, src2);
    } else {
      memcpy(src2, src1, 3 * w * sizeof(*src2));
    }
    StoreGray(src1, best_y + 0, w);
    StoreGray(src2, best_y + w, w);

    UpdateW(src1, target_y, w, rgb_bit_depth, transfer_type);
    UpdateW(src2, target_y + w, w, rgb_bit_depth, transfer_type);
    UpdateChroma(src1, src2, target_uv, uv_w, rgb_bit_depth, transfer_type);
    memcpy(best_uv, target_uv, 3 * uv_w * sizeof(*best_uv));
    best_y += 2 * w;
    best_uv += 3 * uv_w;
    target_y += 2 * w;
    target_uv += 3 * uv_w;
    r_ptr += 2 * rgb_stride;
    g_ptr += 2 * rgb_stride;
    b_ptr += 2 * rgb_stride;
  }

  // Iterate and resolve clipping conflicts.
  for (iter = 0; iter < kNumIterations; ++iter) {
    const fixed_t* cur_uv = best_uv_base;
    const fixed_t* prev_uv = best_uv_base;
    uint64_t diff_y_sum = 0;

    best_y = best_y_base;
    best_uv = best_uv_base;
    target_y = target_y_base;
    target_uv = target_uv_base;
    j = 0;
    do {
      fixed_y_t* const src1 = tmp_buffer + 0 * w;
      fixed_y_t* const src2 = tmp_buffer + 3 * w;
      {
        const fixed_t* const next_uv = cur_uv + ((j < h - 2) ? 3 * uv_w : 0);
        InterpolateTwoRows(best_y, prev_uv, cur_uv, next_uv, w,
                           src1, src2, rgb_bit_depth);
        prev_uv = cur_uv;
        cur_uv = next_uv;
      }

      UpdateW(src1, best_rgb_y + 0 * w, w, rgb_bit_depth, transfer_type);
      UpdateW(src2, best_rgb_y + 1 * w, w, rgb_bit_depth, transfer_type);
      UpdateChroma(src1, src2, best_rgb_uv, uv_w, rgb_bit_depth, transfer_type);

      // update two rows of Y and one row of RGB
      diff_y_sum +=
          SharpYuvUpdateY(target_y, best_rgb_y, best_y, 2 * w, y_bit_depth);
      SharpYuvUpdateRGB(target_uv, best_rgb_uv, best_uv, 3 * uv_w);

      best_y += 2 * w;
      best_uv += 3 * uv_w;
      target_y += 2 * w;
      target_uv += 3 * uv_w;
      j += 2;
    } while (j < h);
    // test exit condition
    if (iter > 0) {
      if (diff_y_sum < diff_y_threshold) break;
      if (diff_y_sum > prev_diff_y_sum) break;
    }
    prev_diff_y_sum = diff_y_sum;
  }

  // final reconstruction
  ok = ConvertWRGBToYUV(best_y_base, best_uv_base, y_ptr, y_stride, u_ptr,
                        u_stride, v_ptr, v_stride, rgb_bit_depth, yuv_bit_depth,
                        width, height, yuv_matrix);

 End:
  free(best_y_base);
  free(best_uv_base);
  free(target_y_base);
  free(target_uv_base);
  free(best_rgb_y);
  free(best_rgb_uv);
  free(tmp_buffer);
  return ok;
}